

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_spr_sw_abort_errno.c
# Opt level: O1

SeatPromptResult *
make_spr_sw_abort_errno(SeatPromptResult *__return_storage_ptr__,char *prefix,int errno_value)

{
  __return_storage_ptr__->kind = SPRK_SW_ABORT;
  __return_storage_ptr__->errfn = spr_errno_errfn;
  __return_storage_ptr__->errdata_lit = prefix;
  __return_storage_ptr__->errdata_u = errno_value;
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult make_spr_sw_abort_errno(const char *prefix, int errno_value)
{
    SeatPromptResult spr;
    spr.kind = SPRK_SW_ABORT;
    spr.errfn = spr_errno_errfn;
    spr.errdata_lit = prefix;
    spr.errdata_u = errno_value;
    return spr;
}